

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void google::InternalStringPrintf(string *output,char *format,__va_list_tag *ap)

{
  char *__s;
  ulong uVar1;
  char *buf;
  int length;
  int bytes_written;
  va_list backup_ap;
  char local_a8 [8];
  char space [128];
  __va_list_tag *ap_local;
  char *format_local;
  string *output_local;
  
  backup_ap[0].overflow_arg_area = ap->reg_save_area;
  length = ap->gp_offset;
  unique0x100000fb = ap->fp_offset;
  backup_ap[0]._0_8_ = ap->overflow_arg_area;
  buf._4_4_ = vsnprintf(local_a8,0x80,format,&length);
  if (((int)buf._4_4_ < 0) || (0x7f < buf._4_4_)) {
    buf._0_4_ = 0x80;
    while( true ) {
      if ((int)buf._4_4_ < 0) {
        buf._0_4_ = (int)buf << 1;
      }
      else {
        buf._0_4_ = buf._4_4_ + 1;
      }
      uVar1 = (ulong)(int)buf;
      if ((long)uVar1 < 0) {
        uVar1 = 0xffffffffffffffff;
      }
      __s = (char *)operator_new__(uVar1);
      backup_ap[0].overflow_arg_area = ap->reg_save_area;
      length = ap->gp_offset;
      unique0x1000011b = ap->fp_offset;
      backup_ap[0]._0_8_ = ap->overflow_arg_area;
      buf._4_4_ = vsnprintf(__s,(long)(int)buf,format,&length);
      if ((-1 < (int)buf._4_4_) && ((int)buf._4_4_ < (int)buf)) break;
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    std::__cxx11::string::append((char *)output,(ulong)__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
  }
  else {
    std::__cxx11::string::append((char *)output,(ulong)local_a8);
  }
  return;
}

Assistant:

inline void InternalStringPrintf(std::string* output, const char* format,
                                 va_list ap) {
  char space[128];    // try a small buffer and hope it fits

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int bytes_written = vsnprintf(space, sizeof(space), format, backup_ap);
  va_end(backup_ap);

  if ((bytes_written >= 0) && (static_cast<size_t>(bytes_written) < sizeof(space))) {
    output->append(space, bytes_written);
    return;
  }

  // Repeatedly increase buffer size until it fits.
  int length = sizeof(space);
  while (true) {
    if (bytes_written < 0) {
      // Older snprintf() behavior. :-(  Just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "bytes_written+1" characters
      length = bytes_written+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
    bytes_written = vsnprintf(buf, length, format, backup_ap);
    va_end(backup_ap);

    if ((bytes_written >= 0) && (bytes_written < length)) {
      output->append(buf, bytes_written);
      delete[] buf;
      return;
    }
    delete[] buf;
  }
}